

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

CURLcode ssl_cf_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  Curl_cfilter *pCVar1;
  ssl_peer *peer;
  char *pcVar2;
  curl_trc_feat *pcVar3;
  void *pvVar4;
  _Bool _Var5;
  CURLcode CVar6;
  ssl_peer *psVar7;
  curltime cVar8;
  
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  pCVar1 = cf->next;
  if (pCVar1 == (Curl_cfilter *)0x0) {
    *done = false;
    return CURLE_FAILED_INIT;
  }
  peer = (ssl_peer *)cf->ctx;
  psVar7 = peer;
  if ((pCVar1->field_0x24 & 1) == 0) {
    CVar6 = (*pCVar1->cft->do_connect)(pCVar1,data,blocking,done);
    if (CVar6 != CURLE_OK) {
      return CVar6;
    }
    if (*done != true) {
      return CURLE_OK;
    }
    psVar7 = (ssl_peer *)cf->ctx;
  }
  pcVar2 = psVar7[1].sni;
  psVar7[1].sni = (char *)data;
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
      ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)))) &&
     (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"cf_connect()");
  }
  *done = false;
  if ((peer->hostname != (char *)0x0) || (CVar6 = Curl_ssl_peer_init(peer,cf,3), CVar6 == CURLE_OK))
  {
    if (blocking) {
      pvVar4 = cf->ctx;
      _Var5 = ssl_prefs_check(data);
      if (_Var5) {
        *(undefined4 *)((long)pvVar4 + 0xa8) = 2;
        CVar6 = (*Curl_ssl->connect_blocking)(cf,data);
      }
      else {
        CVar6 = CURLE_SSL_CONNECT_ERROR;
      }
      *done = CVar6 == CURLE_OK;
    }
    else {
      _Var5 = ssl_prefs_check(data);
      if (!_Var5) {
        CVar6 = CURLE_SSL_CONNECT_ERROR;
        goto LAB_0016ae2c;
      }
      CVar6 = (*Curl_ssl->connect_nonblocking)(cf,data,done);
    }
    if ((CVar6 == CURLE_OK) && (CVar6 = CURLE_OK, *done == true)) {
      cf->field_0x24 = cf->field_0x24 | 1;
      cVar8 = Curl_now();
      peer[1].type = (int)cVar8.tv_sec;
      peer[1].port = (int)((ulong)cVar8.tv_sec >> 0x20);
      peer[1].transport = cVar8.tv_usec;
    }
  }
LAB_0016ae2c:
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
      ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)))) &&
     (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"cf_connect() -> %d, done=%d",(ulong)CVar6,(ulong)*done);
  }
  *(char **)((long)cf->ctx + 0x38) = pcVar2;
  return CVar6;
}

Assistant:

static CURLcode ssl_cf_connect(struct Curl_cfilter *cf,
                               struct Curl_easy *data,
                               bool blocking, bool *done)
{
  struct ssl_connect_data *connssl = cf->ctx;
  struct cf_call_data save;
  CURLcode result;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(!cf->next) {
    *done = FALSE;
    return CURLE_FAILED_INIT;
  }

  if(!cf->next->connected) {
    result = cf->next->cft->do_connect(cf->next, data, blocking, done);
    if(result || !*done)
      return result;
  }

  CF_DATA_SAVE(save, cf, data);
  CURL_TRC_CF(data, cf, "cf_connect()");
  DEBUGASSERT(data->conn);
  DEBUGASSERT(data->conn == cf->conn);
  DEBUGASSERT(connssl);

  *done = FALSE;
  if(!connssl->peer.hostname) {
    result = Curl_ssl_peer_init(&connssl->peer, cf, TRNSPRT_TCP);
    if(result)
      goto out;
  }

  if(blocking) {
    result = ssl_connect(cf, data);
    *done = (result == CURLE_OK);
  }
  else {
    result = ssl_connect_nonblocking(cf, data, done);
  }

  if(!result && *done) {
    cf->connected = TRUE;
    connssl->handshake_done = Curl_now();
    /* Connection can be deferred when sending early data */
    DEBUGASSERT(connssl->state == ssl_connection_complete ||
                connssl->state == ssl_connection_deferred);
  }
out:
  CURL_TRC_CF(data, cf, "cf_connect() -> %d, done=%d", result, *done);
  CF_DATA_RESTORE(cf, save);
  return result;
}